

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  char cVar1;
  ushort uVar2;
  function_record *pfVar3;
  pointer paVar4;
  type_info *ptVar5;
  PyTypeObject *pPVar6;
  long lVar7;
  handle obj;
  function_record *pfVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  char *pcVar12;
  type_info *ptVar13;
  function_record *pfVar14;
  PyMethodDef *pPVar15;
  PyObject *pPVar16;
  PyObject *pPVar17;
  ushort uVar18;
  function_record *pfVar19;
  byte bVar20;
  uint uVar21;
  object *object;
  ulong uVar22;
  pointer paVar23;
  string signatures;
  long local_1d0;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  char *local_1c0;
  undefined1 local_1b8 [24];
  object local_1a0;
  object scope_module;
  string signature;
  capsule rec_capsule_1;
  strdup_guard guarded_strdup;
  undefined1 local_108 [24];
  object local_f0;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_e8;
  type_info **local_e0;
  str local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar3 = (unique_rec->_M_t).
           super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar12 = "";
  if (pfVar3->name != (char *)0x0) {
    pcVar12 = pfVar3->name;
  }
  local_e0 = types;
  pcVar12 = strdup_guard::operator()(&guarded_strdup,pcVar12);
  pfVar3->name = pcVar12;
  if (pfVar3->doc != (char *)0x0) {
    pcVar12 = strdup_guard::operator()(&guarded_strdup,pfVar3->doc);
    pfVar3->doc = pcVar12;
  }
  local_e8 = &pfVar3->args;
  paVar4 = *(pointer *)
            ((long)&(pfVar3->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            + 8);
  for (paVar23 = (pfVar3->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start; paVar23 != paVar4;
      paVar23 = paVar23 + 0x20) {
    if (*(char **)paVar23 != (char *)0x0) {
      pcVar12 = strdup_guard::operator()(&guarded_strdup,*(char **)paVar23);
      *(char **)paVar23 = pcVar12;
    }
    if (*(char **)(paVar23 + 8) == (char *)0x0) {
      if (*(PyObject **)(paVar23 + 0x10) != (PyObject *)0x0) {
        repr((pybind11 *)&signatures,*(PyObject **)(paVar23 + 0x10));
        cast<std::__cxx11::string>(&signature,(pybind11 *)&signatures,object);
        pcVar12 = strdup_guard::operator()(&guarded_strdup,signature._M_dataplus._M_p);
        *(char **)(paVar23 + 8) = pcVar12;
        std::__cxx11::string::~string((string *)&signature);
        pybind11::object::~object((object *)&signatures);
      }
    }
    else {
      pcVar12 = strdup_guard::operator()(&guarded_strdup,*(char **)(paVar23 + 8));
      *(char **)(paVar23 + 8) = pcVar12;
    }
  }
  pcVar12 = pfVar3->name;
  iVar11 = strcmp(pcVar12,"__init__");
  if (iVar11 == 0) {
    uVar18 = 1;
  }
  else {
    iVar11 = strcmp(pcVar12,"__setstate__");
    uVar18 = (ushort)(iVar11 == 0);
  }
  uVar2 = *(ushort *)&pfVar3->field_0x59;
  uVar21 = uVar2 & 0xfffffffe | (uint)uVar18;
  *(short *)&pfVar3->field_0x59 = (short)uVar21;
  if (((uVar2 & 2) == 0 & (byte)uVar18) == 1) {
    detail::get_fully_qualified_tp_name_abi_cxx11_
              (&signature,(detail *)(pfVar3->scope).m_ptr,(PyTypeObject *)(ulong)uVar21);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signatures,pfVar3->name,(allocator<char> *)&rec_capsule_1);
    uVar9 = _PyExc_FutureWarning;
    std::operator+(&local_d0,"pybind11-bound class \'",&signature);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   &local_d0,"\' is using an old-style placement-new \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   &signatures);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rec_capsule_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   "\' which has been deprecated. See the upgrade guide in pybind11\'s docs. This message is only visible when compiled in debug mode."
                  );
    PyErr_WarnEx(uVar9,rec_capsule_1.super_object.super_handle.m_ptr,0);
    std::__cxx11::string::~string((string *)&rec_capsule_1);
    std::__cxx11::string::~string((string *)&scope_module);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&signatures);
    std::__cxx11::string::~string((string *)&signature);
  }
  signature._M_dataplus._M_p = (pointer)&signature.field_2;
  signature._M_string_length = 0;
  signature.field_2._M_local_buf[0] = '\0';
  local_1c0 = text + 1;
  uVar22 = 0;
  local_1d0 = 0;
  do {
    cVar1 = local_1c0[-1];
    if (cVar1 == '%') {
      ptVar5 = local_e0[local_1d0];
      if (ptVar5 == (type_info *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      signatures._M_dataplus._M_p = (pointer)ptVar5;
      ptVar13 = detail::get_type_info((type_index *)&signatures,false);
      local_1d0 = local_1d0 + 1;
      if (ptVar13 == (type_info *)0x0) {
        if ((uVar22 == 0 & (byte)pfVar3->field_0x59 >> 1) == 1) {
          local_1b8._8_8_ = (pfVar3->scope).m_ptr;
          local_1b8._16_8_ = "__module__";
          local_1a0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scope_module,
                     (accessor<pybind11::detail::accessor_policies::str_attr> *)local_1b8);
          std::operator+((string *)&rec_capsule_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,".");
          local_108._8_8_ = (pfVar3->scope).m_ptr;
          local_108._16_8_ = "__qualname__";
          local_f0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    (&local_d0,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_108)
          ;
          std::operator+(&signatures,(string *)&rec_capsule_1,&local_d0);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&signatures);
          std::__cxx11::string::~string((string *)&local_d0);
          pybind11::object::~object(&local_f0);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
          std::__cxx11::string::~string((string *)&scope_module);
          pybind11::object::~object(&local_1a0);
          uVar22 = 0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&signatures,*(char **)(ptVar5 + 8) + (**(char **)(ptVar5 + 8) == '*')
                     ,(allocator<char> *)&rec_capsule_1);
          detail::clean_type_id(&signatures);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&signatures);
        }
      }
      else {
        pPVar6 = ptVar13->type;
        local_1b8._16_8_ = "__module__";
        local_1a0.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_1b8._8_8_ = pPVar6;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   (accessor<pybind11::detail::accessor_policies::str_attr> *)local_1b8);
        std::operator+((string *)&rec_capsule_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scope_module,".");
        local_108._16_8_ = "__qualname__";
        local_f0.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_108._8_8_ = pPVar6;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_d0,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_108);
        std::operator+(&signatures,(string *)&rec_capsule_1,&local_d0);
        std::__cxx11::string::append((string *)&signature);
        std::__cxx11::string::~string((string *)&signatures);
        std::__cxx11::string::~string((string *)&local_d0);
        pybind11::object::~object(&local_f0);
        std::__cxx11::string::~string((string *)&rec_capsule_1);
        std::__cxx11::string::~string((string *)&scope_module);
        pybind11::object::~object(&local_1a0);
      }
    }
    else if (cVar1 == '{') {
      if (*local_1c0 != '*') {
        if (pfVar3->nargs_kw_only + uVar22 == args && pfVar3->nargs_kw_only != 0) {
          std::__cxx11::string::append((char *)&signature);
        }
        lVar7 = *(long *)&(pfVar3->args).
                          super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          ._M_impl.super__Vector_impl_data;
        if (((uVar22 < (ulong)((long)*(pointer *)
                                      ((long)&(pfVar3->args).
                                              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                      + 8) - lVar7 >> 5)) && (*(long *)(lVar7 + uVar22 * 0x20) != 0)
            ) || ((*(ushort *)&pfVar3->field_0x59 & 0x10) != 0 && uVar22 == 0)) {
          std::__cxx11::string::append((char *)&signature);
        }
        else {
          std::__cxx11::to_string
                    ((string *)&rec_capsule_1,
                     uVar22 - ((*(ushort *)&pfVar3->field_0x59 >> 4 & 1) != 0));
          std::operator+(&signatures,"arg",(string *)&rec_capsule_1);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&signatures);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
        }
        std::__cxx11::string::append((char *)&signature);
      }
    }
    else if (cVar1 == '}') {
      lVar7 = *(long *)&(pfVar3->args).
                        super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                        ._M_impl.super__Vector_impl_data;
      if ((uVar22 < (ulong)((long)*(pointer *)
                                   ((long)&(pfVar3->args).
                                           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   + 8) - lVar7 >> 5)) &&
         (*(long *)(lVar7 + 8 + uVar22 * 0x20) != 0)) {
        std::__cxx11::string::append((char *)&signature);
        std::__cxx11::string::append((char *)&signature);
      }
      uVar22 = uVar22 + 1;
      if (uVar22 == pfVar3->nargs_pos_only && pfVar3->nargs_pos_only != 0) {
        std::__cxx11::string::append((char *)&signature);
      }
    }
    else {
      if (cVar1 == '\0') break;
      std::__cxx11::string::push_back((char)&signature);
    }
    local_1c0 = local_1c0 + 1;
  } while( true );
  if ((uVar22 != args) || (local_e0[local_1d0] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar12 = strdup_guard::operator()(&guarded_strdup,signature._M_dataplus._M_p);
  pfVar3->signature = pcVar12;
  std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  ::_M_shrink_to_fit(local_e8);
  pfVar3->nargs = (uint16_t)args;
  pPVar16 = (pfVar3->sibling).m_ptr;
  if (pPVar16 != (PyObject *)0x0) {
    if (pPVar16->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar16 = (PyObject *)pPVar16[1].ob_refcnt;
      (pfVar3->sibling).m_ptr = pPVar16;
      if (pPVar16 == (PyObject *)0x0) goto LAB_0010c908;
    }
    iVar11 = _PyObject_TypeCheck(pPVar16,(PyTypeObject *)&PyCFunction_Type);
    if (iVar11 == 0) {
      if (((pfVar3->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*pfVar3->name != '_')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&scope_module,pfVar3->name,(allocator<char> *)local_1b8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,"Cannot overload existing non-function object \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scope_module);
        std::operator+(&signatures,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,"\" with a function of the same name");
        pybind11_fail(&signatures);
      }
    }
    else {
      pPVar16 = (pfVar3->sibling).m_ptr;
      if ((*(byte *)(pPVar16[1].ob_refcnt + 0x10) & 0x20) == 0) {
        signatures._M_dataplus._M_p = (pointer)pPVar16[1].ob_type;
        if ((PyTypeObject *)signatures._M_dataplus._M_p != (PyTypeObject *)0x0) {
          (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
               (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
        }
      }
      else {
        signatures._M_dataplus._M_p = (pointer)0x0;
      }
      pfVar14 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)&signatures);
      pPVar16 = (pfVar14->scope).m_ptr;
      pPVar17 = (pfVar3->scope).m_ptr;
      pybind11::object::~object((object *)&signatures);
      if (pPVar16 == pPVar17) {
        pPVar16 = (pfVar3->sibling).m_ptr;
        (this->super_function).super_object.super_handle.m_ptr = pPVar16;
        if (pPVar16 != (PyObject *)0x0) {
          pPVar16->ob_refcnt = pPVar16->ob_refcnt + 1;
        }
        uVar18 = *(ushort *)&pfVar3->field_0x59;
        if (((*(ushort *)&pfVar14->field_0x59 ^ uVar18) & 0x10) != 0) {
          pcVar12 = "instance";
          if ((uVar18 & 0x10) == 0) {
            pcVar12 = "static";
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar12,&local_1c1)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                         ,&local_70);
          std::operator+(&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108," method ");
          local_50.obj.m_ptr = (pfVar3->scope).m_ptr;
          local_50.key = "__name__";
          local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          str::str<pybind11::detail::accessor_policies::str_attr>(&local_d8,&local_50);
          str::operator_cast_to_string(&local_90,&local_d8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8,&local_d0,&local_90);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8,".");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,pfVar3->name,&local_1c2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,&local_b0);
          std::operator+(&signatures,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,&signature);
          pybind11_fail(&signatures);
        }
        pfVar8 = pfVar14;
        if ((uVar18 >> 8 & 1) == 0) {
          do {
            pfVar19 = pfVar8;
            pfVar8 = pfVar19->next;
          } while (pfVar8 != (function_record *)0x0);
          pfVar8 = (unique_rec->_M_t).
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
          (unique_rec->_M_t).
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
               (function_record *)0x0;
          pfVar19->next = pfVar8;
          if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
        }
        else {
          pfVar3->next = pfVar14;
          signatures._M_dataplus._M_p = (pointer)pPVar16[1].ob_type;
          if ((PyTypeObject *)signatures._M_dataplus._M_p != (PyTypeObject *)0x0) {
            (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
                 (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
          }
          pfVar14 = (unique_rec->_M_t).
                    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
          (unique_rec->_M_t).
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
               (function_record *)0x0;
          capsule::set_pointer((capsule *)&signatures,pfVar14);
          if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          pybind11::object::~object((object *)&signatures);
          pfVar14 = pfVar3;
        }
        signatures._M_dataplus._M_p = (pointer)&signatures.field_2;
        signatures._M_string_length = 0;
        signatures.field_2._M_allocated_capacity =
             signatures.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (DAT_001ff761 == 1) {
          std::__cxx11::string::append((char *)&signatures);
          std::__cxx11::string::append((char *)&signatures);
          std::__cxx11::string::append((char *)&signatures);
        }
        local_1c0 = (char *)((ulong)local_1c0 & 0xffffffff00000000);
        goto LAB_0010ca87;
      }
    }
  }
LAB_0010c908:
  pPVar15 = (PyMethodDef *)operator_new(0x20);
  pfVar3->def = pPVar15;
  *(undefined8 *)&pPVar15->ml_flags = 0;
  pPVar15->ml_doc = (char *)0x0;
  pPVar15->ml_name = pfVar3->name;
  pPVar15->ml_meth = dispatcher;
  pPVar15->ml_flags = 3;
  pfVar14 = (unique_rec->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  (unique_rec->_M_t).
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (function_record *)0x0;
  capsule::capsule(&rec_capsule_1,pfVar14,initialize_generic::anon_class_1_0_00000001::__invoke);
  if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  scope_module.super_handle.m_ptr = (handle)(PyObject *)0x0;
  obj.m_ptr = (pfVar3->scope).m_ptr;
  if (obj.m_ptr != (PyObject *)0x0) {
    bVar10 = hasattr(obj,"__module__");
    if (bVar10) {
      signatures._M_string_length = (size_type)(pfVar3->scope).m_ptr;
      signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_3bdde;
      signatures.field_2._8_8_ = 0;
      detail::accessor::operator_cast_to_object((accessor *)local_1b8);
    }
    else {
      bVar10 = hasattr((pfVar3->scope).m_ptr,"__name__");
      if (!bVar10) goto LAB_0010ca2d;
      signatures._M_string_length = (size_type)(pfVar3->scope).m_ptr;
      signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_3bb2c;
      signatures.field_2._8_8_ = 0;
      detail::accessor::operator_cast_to_object((accessor *)local_1b8);
    }
    pybind11::object::operator=(&scope_module,(object *)local_1b8);
    pybind11::object::~object((object *)local_1b8);
    pybind11::object::~object((object *)((long)&signatures.field_2 + 8));
  }
LAB_0010ca2d:
  pPVar16 = (PyObject *)
            PyCMethod_New(pfVar3->def,rec_capsule_1.super_object.super_handle.m_ptr,
                          scope_module.super_handle.m_ptr,0);
  (this->super_function).super_object.super_handle.m_ptr = pPVar16;
  if (pPVar16 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object(&scope_module);
  pybind11::object::~object(&rec_capsule_1.super_object);
  signatures._M_dataplus._M_p = (pointer)&signatures.field_2;
  signatures._M_string_length = 0;
  signatures.field_2._M_allocated_capacity =
       signatures.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1c0 = (char *)CONCAT44(local_1c0._4_4_,
                               (int)CONCAT71((int7)((ulong)signatures._M_dataplus._M_p >> 8),1));
  pfVar14 = pfVar3;
LAB_0010ca87:
  bVar20 = 1;
  iVar11 = 0;
  for (; pfVar14 != (function_record *)0x0; pfVar14 = pfVar14->next) {
    if (DAT_001ff761 == 1) {
      if (0 < iVar11) {
        std::__cxx11::string::append((char *)&signatures);
      }
      if ((char)local_1c0 == '\0') {
        iVar11 = iVar11 + 1;
        std::__cxx11::to_string((string *)&scope_module,iVar11);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,(string *)&scope_module,". ");
        std::__cxx11::string::append((string *)&signatures);
        std::__cxx11::string::~string((string *)&rec_capsule_1);
        std::__cxx11::string::~string((string *)&scope_module);
      }
      std::__cxx11::string::append((char *)&signatures);
      std::__cxx11::string::append((char *)&signatures);
      std::__cxx11::string::append((char *)&signatures);
    }
    if (((pfVar14->doc != (char *)0x0) && (*pfVar14->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if ((DAT_001ff761 & 1) == 0 && bVar20 == 0) {
        std::__cxx11::string::append((char *)&signatures);
        bVar20 = 0;
      }
      else {
        bVar20 = bVar20 & DAT_001ff761;
      }
      if ((DAT_001ff761 & 1) != 0) {
        std::__cxx11::string::append((char *)&signatures);
      }
      std::__cxx11::string::append((char *)&signatures);
      if (DAT_001ff761 == 1) {
        std::__cxx11::string::append((char *)&signatures);
      }
    }
  }
  pPVar16 = (this->super_function).super_object.super_handle.m_ptr;
  free(*(void **)(pPVar16[1].ob_refcnt + 0x18));
  if (signatures._M_string_length == 0) {
    pcVar12 = (char *)0x0;
  }
  else {
    pcVar12 = strdup(signatures._M_dataplus._M_p);
  }
  *(char **)(pPVar16[1].ob_refcnt + 0x18) = pcVar12;
  if ((pfVar3->field_0x59 & 0x10) != 0) {
    pPVar17 = (PyObject *)
              PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
    (this->super_function).super_object.super_handle.m_ptr = pPVar17;
    if (pPVar17 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    _Py_DECREF(pPVar16);
  }
  std::__cxx11::string::~string((string *)&signatures);
  std::__cxx11::string::~string((string *)&signature);
  strdup_guard::~strdup_guard(&guarded_strdup);
  return;
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec, const char *text,
                            const std::type_info *const *types, size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destuct the pointer. `initialize` (the caller) still relies on the
        // pointee being alive after this call. Only move out if a `capsule` is going to keep it alive.
        auto rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the strings
        // are only referenced before strdup'ing. So only *after* the following block could `destruct`
        // safely be called, but even then, `repr` could still throw in the middle of copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = guarded_strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = guarded_strdup(a.name);
            if (a.descr)
                a.descr = guarded_strdup(a.descr);
            else if (a.value)
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;
                // Separator for keyword-only arguments, placed before the kw
                // arguments start
                if (rec->nargs_kw_only > 0 && arg_index + rec->nargs_kw_only == args)
                    signature += "*, ";
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only)
                    signature += ", /";
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("__nonzero__");
        }
#endif
        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(), [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next)
                    chain = chain->next;
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc = signatures.empty() ? nullptr : strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }